

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayoutengine.cpp
# Opt level: O3

void qGeomCalc(QList<QLayoutStruct> *chain,int start,int count,int pos,int space,int spacer)

{
  void *pvVar1;
  uint uVar2;
  void *pvVar3;
  int iVar4;
  pointer pQVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int *args;
  int iVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  byte bVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  long in_FS_OFFSET;
  bool bVar24;
  byte local_160;
  int local_154;
  int local_148;
  ulong local_130;
  int local_120;
  int local_11c;
  int local_118;
  int local_114;
  int local_d4;
  QVLABase<int> local_d0;
  undefined1 *local_b8;
  undefined1 *puStack_b0;
  undefined1 *local_a8;
  undefined1 *puStack_a0;
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar4 = count + start;
  if (count < 1) {
    local_160 = 1;
    local_120 = 0;
    uVar2 = 0;
    local_148 = 0;
    uVar10 = 0;
    iVar19 = 0;
    iVar18 = 0;
  }
  else {
    lVar22 = (long)start;
    lVar12 = lVar22 << 5;
    iVar15 = -1;
    local_160 = 1;
    iVar18 = 0;
    iVar19 = 0;
    uVar10 = 0;
    local_148 = 0;
    uVar2 = 0;
    local_120 = 0;
    do {
      pQVar5 = QList<QLayoutStruct>::data(chain);
      (&pQVar5->done)[lVar12] = false;
      iVar16 = *(int *)((long)&pQVar5->stretch + lVar12);
      if ((&pQVar5->empty)[lVar12] == true) {
        bVar14 = (&pQVar5->expansive)[lVar12];
        if (local_160 == 0) {
          local_160 = 0;
        }
        else {
          local_160 = (bVar14 ^ 1) & iVar16 < 1;
        }
      }
      else {
        bVar24 = -1 < iVar15;
        local_160 = 0;
        iVar9 = iVar15;
        if (!bVar24) {
          iVar9 = 0;
        }
        iVar15 = spacer;
        if (spacer < 0) {
          iVar15 = *(int *)((long)&pQVar5->spacing + lVar12);
        }
        local_120 = local_120 + (uint)bVar24;
        local_148 = local_148 + iVar9;
        bVar14 = (&pQVar5->expansive)[lVar12];
      }
      iVar18 = iVar18 + *(int *)((long)&pQVar5->sizeHint + (ulong)(0 < iVar16) * 8 + lVar12);
      iVar19 = iVar19 + *(int *)((long)&pQVar5->minimumSize + lVar12);
      uVar10 = uVar10 + iVar16;
      uVar2 = uVar2 + bVar14;
      lVar22 = lVar22 + 1;
      lVar12 = lVar12 + 0x20;
    } while (lVar22 < iVar4);
  }
  iVar19 = iVar19 + local_148;
  if (space < iVar19) {
    if (-1 < spacer) {
      if (iVar19 < 1) {
        spacer = 0;
      }
      else {
        spacer = (spacer * space) / iVar19;
      }
      local_148 = spacer * local_120;
    }
    local_d0.super_QVLABaseBase.ptr = &local_b8;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
    local_98 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
    local_a8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
    local_b8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_b0 = &DAT_aaaaaaaaaaaaaaaa;
    local_d0.super_QVLABaseBase.a = 0x20;
    local_d0.super_QVLABaseBase.s = 0;
    if (count < 0x21) {
      if (0 < count) goto LAB_002ec20d;
    }
    else {
      QVLABase<int>::reallocate_impl
                (&local_d0,0x20,local_d0.super_QVLABaseBase.ptr,0,(ulong)(uint)count);
LAB_002ec20d:
      lVar12 = (long)start;
      uVar23 = lVar12 << 5 | 0xc;
      do {
        args = (int *)((long)&((chain->d).ptr)->stretch + uVar23);
        if (local_d0.super_QVLABaseBase.s == local_d0.super_QVLABaseBase.a) {
          local_d4 = *args;
          QVLABase<int>::emplace_back_impl<int>(&local_d0,0x20,&local_b8,&local_d4);
        }
        else {
          QVLABase<int>::emplace_back_impl<int_const&>(&local_d0,0x20,&local_b8,args);
        }
        lVar12 = lVar12 + 1;
        uVar23 = uVar23 + 0x20;
      } while (lVar12 < iVar4);
    }
    pvVar3 = local_d0.super_QVLABaseBase.ptr;
    if (local_d0.super_QVLABaseBase.s != 0) {
      pvVar1 = (void *)((long)local_d0.super_QVLABaseBase.ptr + local_d0.super_QVLABaseBase.s * 4);
      lVar12 = 0x3f;
      if (local_d0.super_QVLABaseBase.s != 0) {
        for (; (ulong)local_d0.super_QVLABaseBase.s >> lVar12 == 0; lVar12 = lVar12 + -1) {
        }
      }
      std::__introsort_loop<int*,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_d0.super_QVLABaseBase.ptr,pvVar1,((uint)lVar12 ^ 0x3f) * 2 ^ 0x7e);
      std::__final_insertion_sort<int*,__gnu_cxx::__ops::_Iter_less_iter>(pvVar3,pvVar1);
    }
    local_148 = space - local_148;
    iVar18 = 0;
    if (count < 1) {
      iVar19 = 0;
      iVar15 = 0;
    }
    else {
      iVar19 = 0;
      iVar15 = 0;
      iVar18 = 0;
      if (0 < local_148) {
        uVar23 = 0;
        iVar16 = 0;
        iVar15 = count;
        do {
          iVar18 = *(int *)((long)local_d0.super_QVLABaseBase.ptr + uVar23 * 4);
          iVar19 = iVar18 * iVar15 + iVar16;
          uVar23 = uVar23 + 1;
          if ((uint)count <= uVar23) break;
          iVar16 = iVar16 + iVar18;
          iVar15 = iVar15 + -1;
        } while (iVar19 < local_148);
        iVar15 = -(int)uVar23;
      }
    }
    iVar15 = count + iVar15 + 1;
    uVar23 = (long)(iVar19 - local_148) % (long)iVar15;
    if (0 < count) {
      lVar12 = (long)start;
      uVar20 = lVar12 << 5 | 0x1c;
      iVar16 = 0;
      local_130 = uVar23 & 0xffffffff;
      do {
        iVar16 = iVar16 + (int)uVar23;
        iVar9 = 0;
        if (iVar15 <= iVar16) {
          iVar9 = iVar15;
        }
        iVar11 = (iVar18 - (iVar19 - local_148) / iVar15) - (uint)(iVar15 <= iVar16);
        iVar16 = iVar16 - iVar9;
        pQVar5 = QList<QLayoutStruct>::data(chain);
        iVar9 = *(int *)((long)pQVar5 + (uVar20 - 0x10));
        if (iVar9 < iVar11) {
          iVar11 = iVar9;
        }
        *(int *)((long)&pQVar5->stretch + uVar20) = iVar11;
        *(undefined1 *)((long)pQVar5 + (uVar20 - 6)) = 1;
        lVar12 = lVar12 + 1;
        uVar20 = uVar20 + 0x20;
        uVar23 = local_130;
      } while (lVar12 < iVar4);
    }
    local_11c = spacer;
    if ((undefined1 **)local_d0.super_QVLABaseBase.ptr != &local_b8) {
      QtPrivate::sizedFree(local_d0.super_QVLABaseBase.ptr,local_d0.super_QVLABaseBase.a << 2);
    }
LAB_002ec3db:
    local_118 = 0;
  }
  else {
    local_11c = spacer;
    if (space < local_148 + iVar18) {
      iVar19 = count;
      if (0 < count) {
        lVar12 = (long)start;
        lVar22 = lVar12 << 5;
        do {
          pQVar5 = QList<QLayoutStruct>::data(chain);
          if (((&pQVar5->done)[lVar22] == false) &&
             (iVar15 = *(int *)((long)&pQVar5->sizeHint +
                               (ulong)(0 < *(int *)((long)&pQVar5->stretch + lVar22)) * 8 + lVar22),
             iVar15 <= *(int *)((long)&pQVar5->minimumSize + lVar22))) {
            *(int *)((long)&pQVar5->size + lVar22) = iVar15;
            (&pQVar5->done)[lVar22] = true;
            iVar19 = iVar19 + -1;
          }
          lVar12 = lVar12 + 1;
          lVar22 = lVar22 + 0x20;
        } while (lVar12 < iVar4);
      }
      if (iVar19 != 0) {
        if (0 < count) {
          iVar18 = (local_148 - space) + iVar18;
LAB_002ebff2:
          lVar7 = 0;
          lVar12 = (long)start;
          lVar22 = (long)start << 5;
          do {
            pQVar5 = QList<QLayoutStruct>::data(chain);
            if ((&pQVar5->done)[lVar22] == false) {
              lVar6 = ((long)iVar18 << 8) / (long)iVar19;
              uVar20 = lVar6 + lVar7;
              uVar23 = lVar6 + lVar7 + 0xff;
              if (-1 < (long)uVar20) {
                uVar23 = uVar20;
              }
              iVar9 = (uint)(0x7f < (long)(uVar20 - (uVar23 & 0xffffffffffffff00))) +
                      (int)(uVar23 >> 8);
              iVar15 = *(int *)((long)&pQVar5->sizeHint +
                               (ulong)(0 < *(int *)((long)&pQVar5->stretch + lVar22)) * 8 + lVar22);
              iVar11 = iVar15 - iVar9;
              *(int *)((long)&pQVar5->size + lVar22) = iVar11;
              iVar16 = *(int *)((long)&pQVar5->minimumSize + lVar22);
              if (iVar11 < iVar16) goto LAB_002ec0a9;
              lVar7 = uVar20 + (long)iVar9 * -0x100;
            }
            lVar12 = lVar12 + 1;
            lVar22 = lVar22 + 0x20;
            if (iVar4 <= lVar12) goto LAB_002ec3db;
          } while( true );
        }
        goto LAB_002ec6d5;
      }
      goto LAB_002ec3db;
    }
    local_148 = space - local_148;
    lVar12 = (long)start;
    lVar22 = (long)iVar4;
    local_154 = count;
    if (0 < count) {
      lVar6 = lVar12 << 5;
      lVar7 = lVar12;
      do {
        pQVar5 = QList<QLayoutStruct>::data(chain);
        if ((&pQVar5->done)[lVar6] == false) {
          iVar18 = *(int *)((long)&pQVar5->stretch + lVar6);
          iVar19 = *(int *)((long)&pQVar5->sizeHint + (ulong)(0 < iVar18) * 8 + lVar6);
          if (iVar19 < *(int *)((long)&pQVar5->maximumSize + lVar6)) {
            if (((local_160 != 0) || ((&pQVar5->empty)[lVar6] != true)) ||
               (bVar14 = (&pQVar5->expansive)[lVar6], iVar18 != 0 || (bool)bVar14 != false))
            goto LAB_002ec179;
          }
          else {
            bVar14 = (&pQVar5->expansive)[lVar6];
          }
          *(int *)((long)&pQVar5->size + lVar6) = iVar19;
          (&pQVar5->done)[lVar6] = true;
          local_148 = local_148 - iVar19;
          uVar10 = uVar10 - iVar18;
          uVar2 = uVar2 - bVar14;
          local_154 = local_154 + -1;
        }
LAB_002ec179:
        lVar7 = lVar7 + 1;
        lVar6 = lVar6 + 0x20;
      } while (lVar7 < lVar22);
    }
    lVar7 = lVar12 * 0x20;
    local_118 = local_148;
    while (0 < count) {
      lVar17 = (long)local_118 * 0x100;
      lVar13 = 0;
      iVar18 = 0;
      iVar19 = 0;
      lVar6 = lVar12;
      lVar21 = lVar7;
      do {
        pQVar5 = QList<QLayoutStruct>::data(chain);
        if ((&pQVar5->done)[lVar21] == false) {
          if ((int)uVar10 < 1) {
            if ((int)uVar2 < 1) {
              lVar8 = lVar17 / (long)local_154;
            }
            else {
              lVar8 = (long)((ulong)(&pQVar5->expansive)[lVar21] * lVar17) / (long)(ulong)uVar2;
            }
          }
          else {
            lVar8 = (*(int *)((long)&pQVar5->stretch + lVar21) * lVar17) / (long)(ulong)uVar10;
          }
          uVar20 = lVar8 + lVar13;
          uVar23 = lVar8 + 0xff + lVar13;
          if (-1 < (long)uVar20) {
            uVar23 = uVar20;
          }
          iVar16 = (uint)(0x7f < (long)(uVar20 - (uVar23 & 0xffffffffffffff00))) +
                   (int)(uVar23 >> 8);
          *(int *)((long)&pQVar5->size + lVar21) = iVar16;
          lVar13 = uVar20 + (long)iVar16 * -0x100;
          iVar15 = *(int *)((long)&pQVar5->sizeHint +
                           (ulong)(0 < *(int *)((long)&pQVar5->stretch + lVar21)) * 8 + lVar21);
          if (iVar16 < iVar15) {
            iVar18 = (iVar15 + iVar18) - iVar16;
            local_148 = 0;
          }
          else {
            iVar15 = *(int *)((long)&pQVar5->maximumSize + lVar21);
            local_148 = 0;
            if (iVar15 < iVar16) {
              iVar19 = (iVar19 + iVar16) - iVar15;
            }
          }
        }
        lVar6 = lVar6 + 1;
        lVar21 = lVar21 + 0x20;
      } while (lVar6 < lVar22);
      if ((iVar18 < 1) || (iVar18 < iVar19)) {
LAB_002ec5d6:
        if (((0 < iVar19) && (iVar18 <= iVar19)) &&
           (lVar6 = lVar12, lVar21 = lVar7 + 0x1c, 0 < count)) {
          do {
            pQVar5 = QList<QLayoutStruct>::data(chain);
            if ((*(char *)((long)pQVar5 + lVar21 + -6) == '\0') &&
               (iVar15 = *(int *)((long)pQVar5 + lVar21 + -0x14),
               iVar15 < *(int *)((long)&pQVar5->stretch + lVar21))) {
              *(int *)((long)&pQVar5->stretch + lVar21) = iVar15;
              *(undefined1 *)((long)pQVar5 + lVar21 + -6) = 1;
              uVar10 = uVar10 - *(int *)((long)pQVar5 + lVar21 + -0x1c);
              local_118 = local_118 - iVar15;
              uVar2 = uVar2 - *(byte *)((long)pQVar5 + lVar21 + -8);
              local_154 = local_154 + -1;
            }
            lVar6 = lVar6 + 1;
            lVar21 = lVar21 + 0x20;
          } while (lVar6 < lVar22);
        }
      }
      else {
        lVar6 = lVar12;
        lVar21 = lVar7;
        if (0 < count) {
          do {
            pQVar5 = QList<QLayoutStruct>::data(chain);
            if ((&pQVar5->done)[lVar21] == false) {
              iVar15 = *(int *)((long)&pQVar5->stretch + lVar21);
              iVar16 = *(int *)((long)&pQVar5->sizeHint + (ulong)(0 < iVar15) * 8 + lVar21);
              if (*(int *)((long)&pQVar5->size + lVar21) < iVar16) {
                *(int *)((long)&pQVar5->size + lVar21) = iVar16;
                (&pQVar5->done)[lVar21] = true;
                local_118 = local_118 - iVar16;
                uVar10 = uVar10 - iVar15;
                uVar2 = uVar2 - (&pQVar5->expansive)[lVar21];
                local_154 = local_154 + -1;
              }
            }
            lVar6 = lVar6 + 1;
            lVar21 = lVar21 + 0x20;
          } while (lVar6 < lVar22);
          goto LAB_002ec5d6;
        }
      }
      if ((local_154 < 1) || (iVar19 == iVar18)) break;
    }
    if (local_154 != 0) {
      local_118 = local_148;
    }
  }
  local_118 = local_118 / (local_120 + 2);
  if (0 < count) {
    local_114 = pos + local_118;
    lVar12 = (long)start;
    uVar23 = lVar12 << 5 | 0x1c;
    do {
      pQVar5 = QList<QLayoutStruct>::data(chain);
      *(int *)((long)pQVar5 + (uVar23 - 4)) = local_114;
      local_114 = local_114 + *(int *)((long)&pQVar5->stretch + uVar23);
      if (*(char *)((long)pQVar5 + (uVar23 - 7)) == '\0') {
        iVar18 = local_11c;
        if (local_11c < 0) {
          iVar18 = *(int *)((long)pQVar5 + (uVar23 - 0xc));
        }
        local_114 = local_114 + local_118 + iVar18;
      }
      lVar12 = lVar12 + 1;
      uVar23 = uVar23 + 0x20;
    } while (lVar12 < iVar4);
  }
LAB_002ec6d5:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
LAB_002ec0a9:
  iVar18 = (iVar18 - iVar15) + iVar16;
  iVar19 = iVar19 + -1;
  (&pQVar5->done)[lVar22] = true;
  *(int *)((long)&pQVar5->size + lVar22) = iVar16;
  if (count < 1) goto LAB_002ec6d5;
  goto LAB_002ebff2;
}

Assistant:

void qGeomCalc(QList<QLayoutStruct> &chain, int start, int count, int pos, int space, int spacer)
{
    int cHint = 0;
    int cMin = 0;
    int sumStretch = 0;
    int sumSpacing = 0;
    int expandingCount = 0;

    bool allEmptyNonstretch = true;
    int pendingSpacing = -1;
    int spacerCount = 0;
    int i;

    for (i = start; i < start + count; i++) {
        QLayoutStruct *data = &chain[i];

        data->done = false;
        cHint += data->smartSizeHint();
        cMin += data->minimumSize;
        sumStretch += data->stretch;
        if (!data->empty) {
            /*
                Using pendingSpacing, we ensure that the spacing for the last
                (non-empty) item is ignored.
            */
            if (pendingSpacing >= 0) {
                sumSpacing += pendingSpacing;
                ++spacerCount;
            }
            pendingSpacing = data->effectiveSpacer(spacer);
        }
        if (data->expansive)
            expandingCount++;
        allEmptyNonstretch = allEmptyNonstretch && data->empty && !data->expansive && data->stretch <= 0;
    }

    int extraspace = 0;

    if (space < cMin + sumSpacing) {
        /*
          Less space than minimumSize; take from the biggest first
        */

        int minSize = cMin + sumSpacing;

        // shrink the spacers proportionally
        if (spacer >= 0) {
            spacer = minSize > 0 ? spacer * space / minSize : 0;
            sumSpacing = spacer * spacerCount;
        }

        QVarLengthArray<int, 32> minimumSizes;
        minimumSizes.reserve(count);

        for (i = start; i < start + count; i++)
            minimumSizes << chain.at(i).minimumSize;

        std::sort(minimumSizes.begin(), minimumSizes.end());

        int space_left = space - sumSpacing;

        int sum = 0;
        int idx = 0;
        int space_used=0;
        int current = 0;
        while (idx < count && space_used < space_left) {
            current = minimumSizes.at(idx);
            space_used = sum + current * (count - idx);
            sum += current;
            ++idx;
        }
        --idx;
        int deficit = space_used - space_left;

        int items = count - idx;
        /*
         * If we truncate all items to "current", we would get "deficit" too many pixels. Therefore, we have to remove
         * deficit/items from each item bigger than maxval. The actual value to remove is deficitPerItem + remainder/items
         * "rest" is the accumulated error from using integer arithmetic.
        */
        int deficitPerItem = deficit/items;
        int remainder = deficit % items;
        int maxval = current - deficitPerItem;

        int rest = 0;
        for (i = start; i < start + count; i++) {
            int maxv = maxval;
            rest += remainder;
            if (rest >= items) {
                maxv--;
                rest-=items;
            }
            QLayoutStruct *data = &chain[i];
            data->size = qMin(data->minimumSize, maxv);
            data->done = true;
        }
    } else if (space < cHint + sumSpacing) {
        /*
          Less space than smartSizeHint(), but more than minimumSize.
          Currently take space equally from each, as in Qt 2.x.
          Commented-out lines will give more space to stretchier
          items.
        */
        int n = count;
        int space_left = space - sumSpacing;
        int overdraft = cHint - space_left;

        // first give to the fixed ones:
        for (i = start; i < start + count; i++) {
            QLayoutStruct *data = &chain[i];
            if (!data->done
                 && data->minimumSize >= data->smartSizeHint()) {
                data->size = data->smartSizeHint();
                data->done = true;
                space_left -= data->smartSizeHint();
                // sumStretch -= data->stretch;
                n--;
            }
        }
        bool finished = n == 0;
        while (!finished) {
            finished = true;
            Fixed64 fp_over = toFixed(overdraft);
            Fixed64 fp_w = 0;

            for (i = start; i < start+count; i++) {
                QLayoutStruct *data = &chain[i];
                if (data->done)
                    continue;
                // if (sumStretch <= 0)
                fp_w += fp_over / n;
                // else
                //    fp_w += (fp_over * data->stretch) / sumStretch;
                int w = fRound(fp_w);
                data->size = data->smartSizeHint() - w;
                fp_w -= toFixed(w); // give the difference to the next
                if (data->size < data->minimumSize) {
                    data->done = true;
                    data->size = data->minimumSize;
                    finished = false;
                    overdraft -= data->smartSizeHint() - data->minimumSize;
                    // sumStretch -= data->stretch;
                    n--;
                    break;
                }
            }
        }
    } else { // extra space
        int n = count;
        int space_left = space - sumSpacing;
        // first give to the fixed ones, and handle non-expansiveness
        for (i = start; i < start + count; i++) {
            QLayoutStruct *data = &chain[i];
            if (!data->done
                && (data->maximumSize <= data->smartSizeHint()
                    || (!allEmptyNonstretch && data->empty &&
                        !data->expansive && data->stretch == 0))) {
                data->size = data->smartSizeHint();
                data->done = true;
                space_left -= data->size;
                sumStretch -= data->stretch;
                 if (data->expansive)
                     expandingCount--;
                n--;
            }
        }
        extraspace = space_left;

        /*
          Do a trial distribution and calculate how much it is off.
          If there are more deficit pixels than surplus pixels, give
          the minimum size items what they need, and repeat.
          Otherwise give to the maximum size items, and repeat.

          Paul Olav Tvete has a wonderful mathematical proof of the
          correctness of this principle, but unfortunately this
          comment is too small to contain it.
        */
        int surplus, deficit;
        do {
            surplus = deficit = 0;
            Fixed64 fp_space = toFixed(space_left);
            Fixed64 fp_w = 0;
            for (i = start; i < start + count; i++) {
                QLayoutStruct *data = &chain[i];
                if (data->done)
                    continue;
                extraspace = 0;
                if (sumStretch > 0) {
                    fp_w += (fp_space * data->stretch) / sumStretch;
                } else if (expandingCount > 0) {
                    fp_w += (fp_space * (data->expansive ? 1 : 0)) / expandingCount;
                } else {
                    fp_w += fp_space * 1 / n;
                }
                int w = fRound(fp_w);
                data->size = w;
                fp_w -= toFixed(w); // give the difference to the next
                if (w < data->smartSizeHint()) {
                    deficit +=  data->smartSizeHint() - w;
                } else if (w > data->maximumSize) {
                    surplus += w - data->maximumSize;
                }
            }
            if (deficit > 0 && surplus <= deficit) {
                // give to the ones that have too little
                for (i = start; i < start+count; i++) {
                    QLayoutStruct *data = &chain[i];
                    if (!data->done && data->size < data->smartSizeHint()) {
                        data->size = data->smartSizeHint();
                        data->done = true;
                        space_left -= data->smartSizeHint();
                        sumStretch -= data->stretch;
                        if (data->expansive)
                            expandingCount--;
                        n--;
                    }
                }
            }
            if (surplus > 0 && surplus >= deficit) {
                // take from the ones that have too much
                for (i = start; i < start + count; i++) {
                    QLayoutStruct *data = &chain[i];
                    if (!data->done && data->size > data->maximumSize) {
                        data->size = data->maximumSize;
                        data->done = true;
                        space_left -= data->maximumSize;
                        sumStretch -= data->stretch;
                        if (data->expansive)
                            expandingCount--;
                        n--;
                    }
                }
            }
        } while (n > 0 && surplus != deficit);
        if (n == 0)
            extraspace = space_left;
    }

    /*
      As a last resort, we distribute the unwanted space equally
      among the spacers (counting the start and end of the chain). We
      could, but don't, attempt a sub-pixel allocation of the extra
      space.
    */
    int extra = extraspace / (spacerCount + 2);
    int p = pos + extra;
    for (i = start; i < start+count; i++) {
        QLayoutStruct *data = &chain[i];
        data->pos = p;
        p += data->size;
        if (!data->empty)
            p += data->effectiveSpacer(spacer) + extra;
    }

#ifdef QLAYOUT_EXTRA_DEBUG
    qDebug() << "qGeomCalc" << "start" << start <<  "count" << count <<  "pos" << pos
             <<  "space" << space <<  "spacer" << spacer;
    for (i = start; i < start + count; ++i) {
        qDebug() << i << ':' << chain[i].minimumSize << chain[i].smartSizeHint()
                 << chain[i].maximumSize << "stretch" << chain[i].stretch
                 << "empty" << chain[i].empty << "expansive" << chain[i].expansive
                 << "spacing" << chain[i].spacing;
        qDebug() << "result pos" << chain[i].pos << "size" << chain[i].size;
    }
#endif
}